

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall
duckdb::MutableLogger::MutableLogger
          (MutableLogger *this,LogConfig *config_p,RegisteredLoggingContext context_p,
          LogManager *manager)

{
  (this->super_Logger).manager = manager;
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__MutableLogger_0279e2b8;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  LogConfig::LogConfig(&this->config,config_p);
  (this->context).context.transaction_id.index = context_p.context.transaction_id.index;
  (this->context).context.query_id.index = context_p.context.query_id.index;
  (this->context).context.thread_id.index = context_p.context.thread_id.index;
  (this->context).context.connection_id.index = context_p.context.connection_id.index;
  (this->context).context_id = context_p.context_id;
  (this->context).context.scope = context_p.context.scope;
  *(undefined7 *)&(this->context).context.field_0x1 = context_p.context._1_7_;
  LOCK();
  (this->enabled)._M_base._M_i = (this->config).enabled;
  UNLOCK();
  LOCK();
  (this->level)._M_i = (this->config).level;
  UNLOCK();
  LOCK();
  (this->mode)._M_i = (this->config).mode;
  UNLOCK();
  return;
}

Assistant:

MutableLogger::MutableLogger(LogConfig &config_p, RegisteredLoggingContext context_p, LogManager &manager)
    : Logger(manager), config(config_p), context(context_p) {
	enabled = config.enabled;
	level = config.level;
	mode = config.mode;
}